

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

char * BinaryenModuleAllocateAndWriteText(BinaryenModuleRef module)

{
  bool enabled;
  char *__dest;
  unsigned_long __n2;
  ostringstream local_1b0 [8];
  ostringstream os;
  void *local_38;
  __string_type str;
  
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  enabled = Colors::isEnabled();
  Colors::setEnabled(false);
  std::operator<<((ostream *)local_1b0,module);
  Colors::setEnabled(enabled);
  std::__cxx11::stringbuf::str();
  __dest = (char *)malloc((size_t)(str._M_dataplus._M_p + 1));
  if (str._M_dataplus._M_p + 1 != (pointer)0x0) {
    memcpy(__dest,local_38,(size_t)(str._M_dataplus._M_p + 1));
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return __dest;
}

Assistant:

char* BinaryenModuleAllocateAndWriteText(BinaryenModuleRef module) {
  std::ostringstream os;
  bool colors = Colors::isEnabled();

  Colors::setEnabled(false); // do not use colors for writing
  os << *(Module*)module;
  Colors::setEnabled(colors); // restore colors state

  auto str = os.str();
  const size_t len = str.length() + 1;
  char* output = (char*)malloc(len);
  std::copy_n(str.c_str(), len, output);
  return output;
}